

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O0

int TVMCbArgToReturn(TVMValue *value,int code)

{
  bool bVar1;
  ostringstream *poVar2;
  ostream *poVar3;
  runtime_error *_except_;
  LogCheckError local_68;
  LogCheckError _check_err;
  int tcode;
  TVMArgValue local_50 [2];
  undefined1 local_30 [8];
  TVMRetValue rv;
  int code_local;
  TVMValue *value_local;
  
  rv.super_TVMPODValue_._12_4_ = code;
  tvm::runtime::TVMRetValue::TVMRetValue((TVMRetValue *)local_30);
  tvm::runtime::TVMArgValue::TVMArgValue(local_50,*value,rv.super_TVMPODValue_._12_4_);
  tvm::runtime::TVMRetValue::operator=((TVMRetValue *)local_30,local_50);
  tvm::runtime::TVMRetValue::MoveToCHost
            ((TVMRetValue *)local_30,value,(int *)((long)&_check_err.str + 4));
  dmlc::LogCheck_EQ((dmlc *)&local_68,_check_err.str._4_4_,rv.super_TVMPODValue_._12_4_);
  bVar1 = dmlc::LogCheckError::operator_cast_to_bool(&local_68);
  if (bVar1) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&_except_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/c_runtime_api.cc"
               ,0x24a);
    poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)&_except_);
    poVar3 = std::operator<<((ostream *)poVar2,"Check failed: ");
    poVar3 = std::operator<<(poVar3,"tcode == code");
    poVar3 = std::operator<<(poVar3,(string *)local_68.str);
    std::operator<<(poVar3,": ");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&_except_);
  }
  dmlc::LogCheckError::~LogCheckError(&local_68);
  tvm::runtime::TVMRetValue::~TVMRetValue((TVMRetValue *)local_30);
  return 0;
}

Assistant:

int TVMCbArgToReturn(TVMValue* value, int code) {
  API_BEGIN();
  tvm::runtime::TVMRetValue rv;
  rv = tvm::runtime::TVMArgValue(*value, code);
  int tcode;
  rv.MoveToCHost(value, &tcode);
  CHECK_EQ(tcode, code);
  API_END();
}